

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarSignalFilterGia(Gia_Man_t *p,Ssw_RarPars_t *pPars)

{
  int iVar1;
  Aig_Man_t *pAig_00;
  int RetValue;
  Aig_Man_t *pAig;
  Ssw_RarPars_t *pPars_local;
  Gia_Man_t *p_local;
  
  pAig_00 = Gia_ManToAigSimple(p);
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    Gia_ManReprToAigRepr2(pAig_00,p);
    if (p->pReprs != (Gia_Rpr_t *)0x0) {
      free(p->pReprs);
      p->pReprs = (Gia_Rpr_t *)0x0;
    }
    if (p->pNexts != (int *)0x0) {
      free(p->pNexts);
      p->pNexts = (int *)0x0;
    }
  }
  iVar1 = Ssw_RarSignalFilter(pAig_00,pPars);
  Gia_ManReprFromAigRepr(pAig_00,p);
  Abc_CexFree(p->pCexSeq);
  p->pCexSeq = pAig_00->pSeqModel;
  pAig_00->pSeqModel = (Abc_Cex_t *)0x0;
  Aig_ManStop(pAig_00);
  return iVar1;
}

Assistant:

int Ssw_RarSignalFilterGia( Gia_Man_t * p, Ssw_RarPars_t * pPars )
{
    Aig_Man_t * pAig;
    int RetValue;
    pAig = Gia_ManToAigSimple( p );
    if ( p->pReprs != NULL )
    {
        Gia_ManReprToAigRepr2( pAig, p );
        ABC_FREE( p->pReprs );
        ABC_FREE( p->pNexts );
    }
    RetValue = Ssw_RarSignalFilter( pAig, pPars );
    Gia_ManReprFromAigRepr( pAig, p );
    // save counter-example
    Abc_CexFree( p->pCexSeq );
    p->pCexSeq = pAig->pSeqModel; pAig->pSeqModel = NULL;
    Aig_ManStop( pAig );
    return RetValue;
}